

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocusCrsAtPoint.cpp
# Opt level: O2

double GeoCalcs::LocusCrsAtPoint
                 (Locus *locus,LLPoint *testPt,LLPoint *geoPt,double *dPerpCrs,double dTol)

{
  bool bVar1;
  double dVar2;
  InverseResult result;
  InverseResult local_48;
  
  bVar1 = PtIsOnLocus(locus,testPt,geoPt,dTol);
  if (bVar1) {
    local_48.azimuth = 0.0;
    local_48.reverseAzimuth = 0.0;
    local_48.distance = 0.0;
    DistVincenty(testPt,geoPt,&local_48);
    *dPerpCrs = local_48.azimuth;
    DistVincenty(&locus->geoStart,&locus->geoEnd,&local_48);
    dVar2 = atan((locus->endDist - locus->startDist) / local_48.distance);
    *dPerpCrs = dVar2 + *dPerpCrs;
    dVar2 = DistToLocusP(locus,geoPt,dTol,5e-16);
    dVar2 = *dPerpCrs + *(double *)(&DAT_001591d0 + (ulong)(dVar2 < 0.0) * 8);
    dVar2 = (double)(~-(ulong)(6.283185307179586 < dVar2) & (ulong)dVar2 |
                    (ulong)(dVar2 + -6.283185307179586) & -(ulong)(6.283185307179586 < dVar2));
  }
  else {
    dVar2 = -1.0;
  }
  return dVar2;
}

Assistant:

double LocusCrsAtPoint(const Locus &locus, const LLPoint &testPt, LLPoint &geoPt,
                           double &dPerpCrs, const double dTol)
    {
        if (!PtIsOnLocus(locus, testPt, geoPt, dTol))
            return -1.0;

        InverseResult result;
        DistVincenty(testPt, geoPt, result);
        dPerpCrs = result.azimuth;

        DistVincenty(locus.geoStart, locus.geoEnd, result);
        dPerpCrs += atan((locus.endDist - locus.startDist) / result.distance);

        const double dLocusCrs = DistToLocusP(locus, geoPt, dTol, kEps) < 0 ?
                                 dPerpCrs - M_PI_2 : dPerpCrs + M_PI_2;

        return dLocusCrs > M_2PI ? dLocusCrs - M_2PI : dLocusCrs;
    }